

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::genTexel
               (Random *rng,deUint32 glFormat,int texelBlockSize,int texelCount,deUint8 *buffer)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  CompressedTexFormat format_00;
  deUint32 dVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int x;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  TextureFormatInfo info;
  TextureFormat format;
  PixelBufferAccess access;
  TextureFormatInfo local_108;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float local_98;
  float local_88;
  Vec4 local_78;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  bVar7 = isFloatFormat(glFormat);
  if (bVar7) {
    local_60 = glu::mapGLInternalFormat(glFormat);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_58,&local_60,texelCount,1,1,buffer);
    tcu::getTextureFormatInfo(&local_108,&local_60);
    if (0 < texelCount) {
      x = 0;
      do {
        fVar5 = local_108.valueMax.m_data[0];
        fVar2 = local_108.valueMin.m_data[0];
        local_88 = deRandom_getFloat(&rng->m_rnd);
        fVar6 = local_108.valueMax.m_data[1];
        fVar3 = local_108.valueMin.m_data[1];
        local_98 = deRandom_getFloat(&rng->m_rnd);
        local_c8 = ZEXT416((uint)local_108.valueMin.m_data[2]);
        local_b8 = ZEXT416((uint)local_108.valueMax.m_data[2]);
        local_a8 = deRandom_getFloat(&rng->m_rnd);
        fVar4 = local_108.valueMin.m_data[3];
        fVar13 = local_c8._0_4_;
        fVar14 = local_b8._0_4_;
        fVar15 = local_108.valueMax.m_data[3] - local_108.valueMin.m_data[3];
        fVar12 = deRandom_getFloat(&rng->m_rnd);
        local_78.m_data[0] = local_88 * (fVar5 - fVar2) + fVar2;
        local_78.m_data[1] = local_98 * (fVar6 - fVar3) + fVar3;
        local_78.m_data[2] = local_a8 * (fVar14 - fVar13) + fVar13;
        local_78.m_data[3] = fVar12 * fVar15 + fVar4;
        tcu::PixelBufferAccess::setPixel(&local_58,&local_78,x,0,0);
        x = x + 1;
      } while (texelCount != x);
    }
  }
  else {
    bVar7 = glu::isCompressedFormat(glFormat);
    if (bVar7) {
      format_00 = glu::mapGLCompressedTexFormat(glFormat);
      bVar7 = tcu::isAstcFormat(format_00);
      if (bVar7) {
        if (0 < texelCount) {
          lVar10 = 0;
          do {
            dVar8 = deRandom_getUint32(&rng->m_rnd);
            uVar9 = (dVar8 & 7) << 4;
            uVar1 = *(undefined8 *)(&UNK_009adc08 + uVar9);
            *(undefined8 *)(buffer + (int)lVar10) = *(undefined8 *)(&DAT_009adc00 + uVar9);
            *(undefined8 *)(buffer + (int)lVar10 + 8) = uVar1;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)(uint)texelCount << 4 != lVar10);
        }
      }
      else if (0 < texelCount * texelBlockSize) {
        uVar11 = 0;
        do {
          dVar8 = deRandom_getUint32(&rng->m_rnd);
          buffer[uVar11] = (deUint8)dVar8;
          uVar11 = uVar11 + 1;
        } while ((uint)(texelCount * texelBlockSize) != uVar11);
      }
    }
    else if (0 < texelCount * texelBlockSize) {
      uVar11 = 0;
      do {
        dVar8 = deRandom_getUint32(&rng->m_rnd);
        buffer[uVar11] = (deUint8)dVar8;
        uVar11 = uVar11 + 1;
      } while ((uint)(texelCount * texelBlockSize) != uVar11);
    }
  }
  return;
}

Assistant:

void genTexel (de::Random& rng, deUint32 glFormat, int texelBlockSize, const int texelCount, deUint8* buffer)
{
	if (isFloatFormat(glFormat))
	{
		const tcu::TextureFormat		format	= glu::mapGLInternalFormat(glFormat);
		const tcu::PixelBufferAccess	access	(format, texelCount, 1, 1, buffer);
		const tcu::TextureFormatInfo	info	= tcu::getTextureFormatInfo(format);

		for (int texelNdx = 0; texelNdx < texelCount; texelNdx++)
		{
			const float	red		= rng.getFloat(info.valueMin.x(), info.valueMax.x());
			const float green	= rng.getFloat(info.valueMin.y(), info.valueMax.y());
			const float blue	= rng.getFloat(info.valueMin.z(), info.valueMax.z());
			const float alpha	= rng.getFloat(info.valueMin.w(), info.valueMax.w());

			const Vec4	color	(red, green, blue, alpha);

			access.setPixel(color, texelNdx, 0, 0);
		}
	}
	else if (glu::isCompressedFormat(glFormat))
	{
		const tcu::CompressedTexFormat compressedFormat = glu::mapGLCompressedTexFormat(glFormat);

		if (tcu::isAstcFormat(compressedFormat))
		{
			const int		BLOCK_SIZE				= 16;
			const deUint8	blocks[][BLOCK_SIZE]	=
			{
				// \note All of the following blocks are valid in LDR mode.
				{ 252,	253,	255,	255,	255,	255,	255,	255,	8,		71,		90,		78,		22,		17,		26,		66,		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	220,	74,		139,	235,	249,	6,		145,	125		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	223,	251,	28,		206,	54,		251,	160,	174		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	39,		4,		153,	219,	180,	61,		51,		37		},
				{ 67,	2,		0,		254,	1,		0,		64,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	0,		170,	84,		255,	65,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	2,		129,	38,		51,		229,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	193,	56,		213,	144,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		}
			};

			DE_ASSERT(texelBlockSize == BLOCK_SIZE);

			for (int i = 0; i < texelCount; i++)
			{
				const int blockNdx = rng.getInt(0, DE_LENGTH_OF_ARRAY(blocks)-1);

				deMemcpy(buffer + i * BLOCK_SIZE,  blocks[blockNdx], BLOCK_SIZE);
			}
		}
		else
		{
			for (int i = 0; i < texelBlockSize * texelCount; i++)
			{
				const deUint8 val = rng.getUint8();

				buffer[i] = val;
			}
		}
	}
	else
	{
		for (int i = 0; i < texelBlockSize * texelCount; i++)
		{
			const deUint8 val = rng.getUint8();

			buffer[i] = val;
		}
	}
}